

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O2

void __thiscall QHttpSocketEngine::slotSocketError(QHttpSocketEngine *this,SocketError error)

{
  QDebug *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  char *local_50;
  QDebug local_48;
  QDebug local_40;
  undefined1 local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(*(long *)(this + 8) + 0x108) == 2) {
    if (error != SocketTimeoutError) {
      *(undefined4 *)(*(long *)(this + 8) + 0x108) = 0;
      QIODevice::errorString();
      QAbstractSocketEngine::setError((QAbstractSocketEngine *)this,error,(QString *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      if (error != RemoteHostClosedError) {
        local_68.d._0_4_ = 2;
        local_68.size._4_4_ = 0;
        local_68._4_8_ = 0;
        local_68._12_8_ = 0;
        local_50 = "default";
        QMessageLogger::debug();
        pQVar1 = QDebug::operator<<(&local_48,
                                    "QHttpSocketEngine::slotSocketError: got weird error =");
        local_40.stream = pQVar1->stream;
        *(int *)(local_40.stream + 0x28) = *(int *)(local_40.stream + 0x28) + 1;
        ::operator<<((Stream *)local_38,(SocketError)&local_40);
        QDebug::~QDebug((QDebug *)local_38);
        QDebug::~QDebug(&local_40);
        QDebug::~QDebug(&local_48);
      }
      emitReadNotification(this);
    }
  }
  else {
    switch(error) {
    case ConnectionRefusedError:
      tr((QString *)&local_68,"Proxy connection refused",(char *)0x0,-1);
      error = ProxyConnectionRefusedError;
      break;
    case RemoteHostClosedError:
      tr((QString *)&local_68,"Proxy connection closed prematurely",(char *)0x0,-1);
      error = ProxyConnectionClosedError;
      break;
    case HostNotFoundError:
      tr((QString *)&local_68,"Proxy server not found",(char *)0x0,-1);
      error = ProxyNotFoundError;
      break;
    default:
      QIODevice::errorString();
      break;
    case SocketTimeoutError:
      tr((QString *)&local_68,"Proxy server connection timed out",(char *)0x0,-1);
      error = ProxyConnectionTimeoutError;
    }
    QAbstractSocketEngine::setError((QAbstractSocketEngine *)this,error,(QString *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    emitConnectionNotification(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpSocketEngine::slotSocketError(QAbstractSocket::SocketError error)
{
    Q_D(QHttpSocketEngine);

    if (d->state != Connected) {
        // we are in proxy handshaking stages
        if (error == QAbstractSocket::HostNotFoundError)
            setError(QAbstractSocket::ProxyNotFoundError, tr("Proxy server not found"));
        else if (error == QAbstractSocket::ConnectionRefusedError)
            setError(QAbstractSocket::ProxyConnectionRefusedError, tr("Proxy connection refused"));
        else if (error == QAbstractSocket::SocketTimeoutError)
            setError(QAbstractSocket::ProxyConnectionTimeoutError, tr("Proxy server connection timed out"));
        else if (error == QAbstractSocket::RemoteHostClosedError)
            setError(QAbstractSocket::ProxyConnectionClosedError, tr("Proxy connection closed prematurely"));
        else
            setError(error, d->socket->errorString());
        emitConnectionNotification();
        return;
    }

    // We're connected
    if (error == QAbstractSocket::SocketTimeoutError)
        return;                 // ignore this error

    d->state = None;
    setError(error, d->socket->errorString());
    if (error != QAbstractSocket::RemoteHostClosedError)
        qDebug() << "QHttpSocketEngine::slotSocketError: got weird error =" << error;
    //read notification needs to always be emitted, otherwise the higher layer doesn't get the disconnected signal
    emitReadNotification();
}